

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseOutgoing.cpp
# Opt level: O2

void __thiscall tonk::SessionOutgoing::tonk_status(SessionOutgoing *this,TonkStatus *statusOut)

{
  uint uVar1;
  uint uVar2;
  uint bytes;
  Locker locker;
  Locker local_30;
  
  local_30.TheLock = &this->OutgoingQueueLock;
  std::recursive_mutex::lock(&(local_30.TheLock)->cs);
  uVar2 = this->Queues[3].QueuedBytes;
  bytes = this->Queues[1].QueuedBytes + this->Queues[0].QueuedBytes + this->Queues[2].QueuedBytes;
  Locker::~Locker(&local_30);
  uVar1 = SenderBandwidthControl::CalculateSendTimeMsec((this->Deps).SenderControl,bytes);
  statusOut->ReliableQueueMsec = uVar1;
  uVar2 = SenderBandwidthControl::CalculateSendTimeMsec((this->Deps).SenderControl,uVar2 + bytes);
  statusOut->LowPriQueueMsec = uVar2;
  statusOut->AppBPS = (((this->Deps).SenderControl)->Shape).AppBPS;
  return;
}

Assistant:

void SessionOutgoing::tonk_status(TonkStatus& statusOut) const
{
    // WARNING: This function is not called on the Connection green thread,
    // so accessing members here is not threadsafe by default.

    unsigned unreliableQueueDepthBytes, reliableQueueDepthBytes, lowpriQueueDepthBytes;

    {
        Locker locker(OutgoingQueueLock);

        unreliableQueueDepthBytes = Queues[Queue_Unreliable].GetQueuedBytes();
        reliableQueueDepthBytes = Queues[Queue_Unmetered].GetQueuedBytes()
            + Queues[Queue_Reliable].GetQueuedBytes();
        lowpriQueueDepthBytes = Queues[Queue_LowPri].GetQueuedBytes();
    }

    // Reliable queue is behind unreliable queue
    reliableQueueDepthBytes += unreliableQueueDepthBytes;

    // Calculate reliable queue depth in milliseconds
    statusOut.ReliableQueueMsec = Deps.SenderControl->CalculateSendTimeMsec(
        reliableQueueDepthBytes);

    // Lowpri queue is behind reliable and unreliable queues
    lowpriQueueDepthBytes += reliableQueueDepthBytes;

    // Calculate lowpri queue depth in milliseconds
    statusOut.LowPriQueueMsec = Deps.SenderControl->CalculateSendTimeMsec(
        lowpriQueueDepthBytes);

    // Read BPS from bandwidth control
    statusOut.AppBPS = Deps.SenderControl->GetAppBPS();
}